

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero-delay-observer.cpp
# Opt level: O1

StateVector __thiscall
stateObservation::ZeroDelayObserver::getEstimatedState(ZeroDelayObserver *this,TimeIndex k)

{
  long lVar1;
  long in_RDX;
  Index extraout_RDX;
  StateVector SVar2;
  void *local_40 [2];
  
  if (*(char *)(k + 0x20) == '\0') {
    __assert_fail("stateIsSet() && \"The state vector has not been set\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x93,
                  "virtual ObserverBase::StateVector stateObservation::ZeroDelayObserver::getEstimatedState(TimeIndex)"
                 );
  }
  lVar1 = (**(code **)(*(long *)k + 0x110))(k);
  if (in_RDX < lVar1) {
    __assert_fail("k0 <= k && \"ERROR: The observer cannot estimate previous states\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/src/zero-delay-observer.cpp"
                  ,0x97,
                  "virtual ObserverBase::StateVector stateObservation::ZeroDelayObserver::getEstimatedState(TimeIndex)"
                 );
  }
  if (lVar1 < in_RDX) {
    do {
      (**(code **)(*(long *)k + 0x138))(local_40,k);
      free(local_40[0]);
      if (*(long *)(k + 0x40) < in_RDX) {
        if ((*(long *)(k + 0x68) - *(long *)(k + 0x58) >> 4) +
            (*(long *)(k + 0x78) - *(long *)(k + 0x80) >> 4) +
            ((((ulong)(*(long *)(k + 0x90) - *(long *)(k + 0x70)) >> 3) - 1) +
            (ulong)(*(long *)(k + 0x90) == 0)) * 0x20 == 0) goto LAB_0013d426;
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::pop_front((deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)(k + 0x48));
        *(long *)(k + 0x40) = *(long *)(k + 0x40) + 1;
      }
      if ((0 < *(long *)(k + 0x18)) && (*(long *)(k + 0x98) < in_RDX)) {
        if ((*(long *)(k + 0xc0) - *(long *)(k + 0xb0) >> 4) +
            (*(long *)(k + 0xd0) - *(long *)(k + 0xd8) >> 4) +
            ((((ulong)(*(long *)(k + 0xe8) - *(long *)(k + 200)) >> 3) - 1) +
            (ulong)(*(long *)(k + 0xe8) == 0)) * 0x20 == 0) {
LAB_0013d426:
          __assert_fail("v_.size() && \"Error: Matrix array is empty\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                        ,0x19a,
                        "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_() const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
                       );
        }
        std::
        deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::pop_front((deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     *)(k + 0xa0));
        *(long *)(k + 0x98) = *(long *)(k + 0x98) + 1;
      }
      lVar1 = lVar1 + 1;
    } while (in_RDX != lVar1);
  }
  if (*(char *)(k + 0x20) != '\0') {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)this,
               (DenseStorage<double,__1,__1,_1,_0> *)(k + 0x30));
    SVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         extraout_RDX;
    SVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (StateVector)
           SVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  __assert_fail("isSet() && \"Error: Matrix not initialized, if you are initializing it,                             use set() function.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                ,0xd6,
                "bool stateObservation::IndexedMatrixT<Eigen::Matrix<double, -1, 1>>::check_() const [MatrixType = Eigen::Matrix<double, -1, 1>, lazy = false]"
               );
}

Assistant:

ObserverBase::StateVector ZeroDelayObserver::getEstimatedState(TimeIndex k)
{
  BOOST_ASSERT(stateIsSet() && "The state vector has not been set");

  TimeIndex k0 = getCurrentTime();

  BOOST_ASSERT(k0 <= k && "ERROR: The observer cannot estimate previous states");

  for(TimeIndex i = k0; i < k; ++i)
  {
    oneStepEstimation_();
    if(y_.getFirstIndex() < k) y_.popFront();

    if(p_ > 0)
      if(u_.getFirstIndex() < k) u_.popFront();
  }

  return x_();
}